

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O2

void test_zeroing<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true>>>
               (void)

{
  shared_count sStack_208;
  char *local_200;
  char *local_1f8;
  undefined **local_1f0;
  undefined1 local_1e8;
  undefined8 *local_1e0;
  char **local_1d8;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  orderedBoundaries;
  Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_> m;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true>>>>
            ();
  Gudhi::persistence_matrix::
  Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true>>::
  Matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true>> *)&m,
             &orderedBoundaries,5);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x26d);
  Gudhi::persistence_matrix::
  Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>_>
  ::is_zero_entry(&m.matrix_,3,1);
  sStack_208.pi_ = (sp_counted_base *)0x0;
  local_200 = "!m.is_zero_entry(3, 1)";
  local_1f8 = "";
  local_1e8 = 0;
  local_1f0 = &PTR__lazy_ostream_001a3358;
  local_1e0 = &boost::unit_test::lazy_ostream::inst;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_58 = "";
  local_1d8 = &local_200;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_208);
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x26e);
  sStack_208.pi_ = (sp_counted_base *)0x0;
  local_200 = "!m.is_zero_column(3)";
  local_1f8 = "";
  local_1e8 = 0;
  local_1f0 = &PTR__lazy_ostream_001a3358;
  local_1e0 = &boost::unit_test::lazy_ostream::inst;
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_88 = "";
  local_1d8 = &local_200;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_208);
  Gudhi::persistence_matrix::
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>_>
  ::clear(m.matrix_.matrix_.
          super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start + 3,
          m.matrix_.
          super_template_Base_swap_option<Base_matrix<Matrix<Base_options<true,_(Column_types)7,_false,_true>_>_>_>
          .indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[1]);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x270);
  Gudhi::persistence_matrix::
  Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>_>
  ::is_zero_entry(&m.matrix_,3,1);
  sStack_208.pi_ = (sp_counted_base *)0x0;
  local_200 = "m.is_zero_entry(3, 1)";
  local_1f8 = "";
  local_1e8 = 0;
  local_1f0 = &PTR__lazy_ostream_001a3358;
  local_1e0 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_b8 = "";
  local_1d8 = &local_200;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_208);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x271);
  sStack_208.pi_ = (sp_counted_base *)0x0;
  local_200 = "!m.is_zero_column(3)";
  local_1f8 = "";
  local_1e8 = 0;
  local_1f0 = &PTR__lazy_ostream_001a3358;
  local_1e0 = &boost::unit_test::lazy_ostream::inst;
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_e8 = "";
  local_1d8 = &local_200;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_208);
  Gudhi::persistence_matrix::
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>_>
  ::clear(m.matrix_.matrix_.
          super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start + 3);
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x273);
  Gudhi::persistence_matrix::
  Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>_>
  ::is_zero_entry(&m.matrix_,3,1);
  sStack_208.pi_ = (sp_counted_base *)0x0;
  local_200 = "m.is_zero_entry(3, 1)";
  local_1f8 = "";
  local_1e8 = 0;
  local_1f0 = &PTR__lazy_ostream_001a3358;
  local_1e0 = &boost::unit_test::lazy_ostream::inst;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_118 = "";
  local_1d8 = &local_200;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_208);
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_128 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x274);
  sStack_208.pi_ = (sp_counted_base *)0x0;
  local_200 = "m.is_zero_column(3)";
  local_1f8 = "";
  local_1e8 = 0;
  local_1f0 = &PTR__lazy_ostream_001a3358;
  local_1e0 = &boost::unit_test::lazy_ostream::inst;
  local_1d8 = &local_200;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_208);
  Gudhi::persistence_matrix::
  Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>::~Matrix(&m);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&orderedBoundaries);
  return;
}

Assistant:

void test_zeroing() {
  auto orderedBoundaries = build_simple_boundary_matrix<typename Matrix::Column>();

  Matrix m(orderedBoundaries, 5);

  BOOST_CHECK(!m.is_zero_entry(3, 1));
  BOOST_CHECK(!m.is_zero_column(3));
  m.zero_entry(3, 1);
  BOOST_CHECK(m.is_zero_entry(3, 1));
  BOOST_CHECK(!m.is_zero_column(3));
  m.zero_column(3);
  BOOST_CHECK(m.is_zero_entry(3, 1));
  BOOST_CHECK(m.is_zero_column(3));
}